

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O3

BVSparseNode * __thiscall
BVSparse<Memory::Recycler>::NodeFromIndex
          (BVSparse<Memory::Recycler> *this,BVIndex i,Type **prevNextFieldOut)

{
  Type *addr;
  uint uVar1;
  BVSparse<Memory::Recycler> *pBVar2;
  uint uVar3;
  BVSparse<Memory::Recycler> *pBVar4;
  BVSparse<Memory::Recycler> *pBVar5;
  BVSparse<Memory::Recycler> *pBVar6;
  BVSparseNode<Memory::Recycler> *pBVar7;
  uint uVar8;
  
  addr = &this->lastFoundIndex;
  pBVar2 = (BVSparse<Memory::Recycler> *)(this->head).ptr;
  if (pBVar2 == (BVSparse<Memory::Recycler> *)0x0) {
    pBVar7 = (this->head).ptr;
LAB_00b1d6d3:
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pBVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  else {
    uVar8 = i & 0xffffffc0;
    uVar3 = *(uint *)&(pBVar2->lastFoundIndex).ptr;
    if (uVar3 == uVar8) {
      *prevNextFieldOut = &this->head;
      return (BVSparseNode *)pBVar2;
    }
    pBVar4 = (BVSparse<Memory::Recycler> *)(this->lastFoundIndex).ptr;
    pBVar5 = this;
    pBVar6 = pBVar2;
    if ((pBVar4 != (BVSparse<Memory::Recycler> *)0x0) &&
       (uVar1 = *(uint *)&(pBVar4->lastFoundIndex).ptr, uVar1 != uVar3)) {
      if (uVar1 == uVar8) {
        *prevNextFieldOut = addr;
        return (BVSparseNode *)pBVar4;
      }
      pBVar5 = (BVSparse<Memory::Recycler> *)addr;
      if (uVar8 <= uVar1) {
        pBVar4 = pBVar2;
        pBVar5 = this;
      }
      uVar3 = *(uint *)&(pBVar4->lastFoundIndex).ptr;
      pBVar6 = pBVar4;
    }
    if (uVar8 < uVar3) {
      pBVar6 = pBVar2;
      pBVar5 = this;
    }
    if (*(uint *)&(pBVar6->lastFoundIndex).ptr < uVar8) {
      pBVar7 = (BVSparseNode<Memory::Recycler> *)0x0;
      do {
        pBVar5 = pBVar6;
        pBVar6 = (BVSparse<Memory::Recycler> *)(pBVar5->head).ptr;
        if (pBVar6 == (BVSparse<Memory::Recycler> *)0x0) goto LAB_00b1d6d3;
      } while (*(uint *)&(pBVar6->lastFoundIndex).ptr < uVar8);
    }
    pBVar7 = (pBVar5->head).ptr;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pBVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    if (uVar8 == *(Type *)&(pBVar6->lastFoundIndex).ptr) {
      *prevNextFieldOut = &pBVar5->head;
      return (BVSparseNode *)pBVar6;
    }
  }
  return (BVSparseNode *)0x0;
}

Assistant:

const BVSparseNode<TAllocator> *
BVSparse<TAllocator>::NodeFromIndex(BVIndex i, Field(BVSparseNode*, TAllocator) const** prevNextFieldOut) const
{
    const BVIndex searchIndex = SparseBVUnit::Floor(i);

    Field(BVSparseNode*, TAllocator) const* prevNextField = &this->head;
    Field(BVSparseNode*, TAllocator) const* prevLastField = &this->lastFoundIndex;

    const BVSparseNode * curNode  = *prevNextField,
                       * lastNode = *prevLastField;
    if (curNode != nullptr)
    {
        if (curNode->startIndex == searchIndex)
        {
            *prevNextFieldOut = prevNextField;
            return curNode;
        }

        if (lastNode && lastNode->startIndex != curNode->startIndex)
        {
            if (lastNode->startIndex == searchIndex)
            {
                *prevNextFieldOut = prevLastField;
                return lastNode;
            }

            if (lastNode->startIndex < searchIndex)
            {
                prevNextField = &this->lastFoundIndex;
                curNode = this->lastFoundIndex;
            }
        }

        if (curNode->startIndex > searchIndex)
        {
            prevNextField = &this->head;
            curNode = this->head;
        }
    }
    else
    {
        prevNextField = &this->head;
        curNode = this->head;
    }

    for (; curNode && searchIndex > curNode->startIndex; curNode = curNode->next)
    {
        prevNextField = &curNode->next;
    }

    const_cast<BVSparse<TAllocator>*>(this)->lastFoundIndex = *prevNextField;

    if (curNode && searchIndex == curNode->startIndex)
    {
        *prevNextFieldOut = prevNextField;
        return curNode;
    }

    return nullptr;
}